

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

SurfaceInteraction * __thiscall
phyr::Transform::operator()
          (SurfaceInteraction *__return_storage_ptr__,Transform *this,SurfaceInteraction *si)

{
  bool bVar1;
  double dVar2;
  Normal3<double> *pNVar3;
  anon_struct_128_6_d0712383_for_shadingGeom *n1;
  Point3<double> local_68;
  Normal3<double> *local_50;
  Normal3<double> local_48;
  
  memset(__return_storage_ptr__,0,0x1b0);
  operator()(&local_68,this,(Point3<double> *)si,&(si->super_Interaction).pfError,
             &(__return_storage_ptr__->super_Interaction).pfError);
  (__return_storage_ptr__->super_Interaction).p.z = local_68.z;
  (__return_storage_ptr__->super_Interaction).p.x = local_68.x;
  (__return_storage_ptr__->super_Interaction).p.y = local_68.y;
  operator()(this,&(si->super_Interaction).n);
  normalize<double>((Normal3<double> *)&local_68,&local_48);
  local_50 = &(__return_storage_ptr__->super_Interaction).n;
  (__return_storage_ptr__->super_Interaction).n.z = local_68.z;
  (__return_storage_ptr__->super_Interaction).n.x = local_68.x;
  (__return_storage_ptr__->super_Interaction).n.y = local_68.y;
  operator()(this,&(si->super_Interaction).wo);
  normalize<double>((Vector3<double> *)&local_68,(Vector3<double> *)&local_48);
  (__return_storage_ptr__->super_Interaction).wo.z = local_68.z;
  (__return_storage_ptr__->super_Interaction).wo.x = local_68.x;
  (__return_storage_ptr__->super_Interaction).wo.y = local_68.y;
  dVar2 = (si->uv).y;
  (__return_storage_ptr__->uv).x = (si->uv).x;
  (__return_storage_ptr__->uv).y = dVar2;
  __return_storage_ptr__->shape = si->shape;
  operator()(this,&si->dpdu);
  (__return_storage_ptr__->dpdu).z = local_68.z;
  (__return_storage_ptr__->dpdu).x = local_68.x;
  (__return_storage_ptr__->dpdu).y = local_68.y;
  operator()(this,&si->dpdv);
  (__return_storage_ptr__->dpdv).z = local_68.z;
  (__return_storage_ptr__->dpdv).x = local_68.x;
  (__return_storage_ptr__->dpdv).y = local_68.y;
  operator()(this,&si->dndu);
  (__return_storage_ptr__->dndu).z = local_68.z;
  (__return_storage_ptr__->dndu).x = local_68.x;
  (__return_storage_ptr__->dndu).y = local_68.y;
  operator()(this,&si->dndv);
  (__return_storage_ptr__->dndv).z = local_68.z;
  (__return_storage_ptr__->dndv).x = local_68.x;
  (__return_storage_ptr__->dndv).y = local_68.y;
  operator()(this,&(si->shadingGeom).n);
  normalize<double>((Normal3<double> *)&local_68,&local_48);
  n1 = &__return_storage_ptr__->shadingGeom;
  (__return_storage_ptr__->shadingGeom).n.z = local_68.z;
  (__return_storage_ptr__->shadingGeom).n.x = local_68.x;
  (__return_storage_ptr__->shadingGeom).n.y = local_68.y;
  operator()(this,&(si->shadingGeom).dpdu);
  (__return_storage_ptr__->shadingGeom).dpdu.z = local_68.z;
  (__return_storage_ptr__->shadingGeom).dpdu.x = local_68.x;
  (__return_storage_ptr__->shadingGeom).dpdu.y = local_68.y;
  operator()(this,&(si->shadingGeom).dpdv);
  (__return_storage_ptr__->shadingGeom).dpdv.z = local_68.z;
  (__return_storage_ptr__->shadingGeom).dpdv.x = local_68.x;
  (__return_storage_ptr__->shadingGeom).dpdv.y = local_68.y;
  operator()(this,&(si->shadingGeom).dndu);
  (__return_storage_ptr__->shadingGeom).dndu.z = local_68.z;
  (__return_storage_ptr__->shadingGeom).dndu.x = local_68.x;
  (__return_storage_ptr__->shadingGeom).dndu.y = local_68.y;
  operator()(this,&(si->shadingGeom).dndv);
  (__return_storage_ptr__->shadingGeom).dndv.z = local_68.z;
  (__return_storage_ptr__->shadingGeom).dndv.x = local_68.x;
  (__return_storage_ptr__->shadingGeom).dndv.y = local_68.y;
  __return_storage_ptr__->bsdf = si->bsdf;
  __return_storage_ptr__->object = si->object;
  dVar2 = si->dvdx;
  __return_storage_ptr__->dudx = si->dudx;
  __return_storage_ptr__->dvdx = dVar2;
  dVar2 = si->dvdy;
  __return_storage_ptr__->dudy = si->dudy;
  __return_storage_ptr__->dvdy = dVar2;
  operator()(this,&si->dpdx);
  (__return_storage_ptr__->dpdx).z = local_68.z;
  (__return_storage_ptr__->dpdx).x = local_68.x;
  (__return_storage_ptr__->dpdx).y = local_68.y;
  operator()(this,&si->dpdy);
  pNVar3 = local_50;
  (__return_storage_ptr__->dpdy).z = local_68.z;
  (__return_storage_ptr__->dpdy).x = local_68.x;
  (__return_storage_ptr__->dpdy).y = local_68.y;
  bVar1 = (si->shadingGeom).overridesOrientation;
  (__return_storage_ptr__->shadingGeom).overridesOrientation = bVar1;
  if (bVar1 == true) {
    faceForward<double>((Normal3<double> *)&local_68,local_50,&n1->n);
    pNVar3->z = local_68.z;
    pNVar3->x = local_68.x;
    pNVar3->y = local_68.y;
  }
  else {
    faceForward<double>((Normal3<double> *)&local_68,&n1->n,local_50);
    (__return_storage_ptr__->shadingGeom).n.z = local_68.z;
    (n1->n).x = local_68.x;
    (__return_storage_ptr__->shadingGeom).n.y = local_68.y;
  }
  return __return_storage_ptr__;
}

Assistant:

SurfaceInteraction Transform::operator()(const SurfaceInteraction& si) const {
    SurfaceInteraction nsi;
    const Transform& tr = *this;

    // Interaction members
    nsi.p = tr(si.p, si.pfError, &nsi.pfError);
    nsi.n = normalize(tr(si.n)); nsi.wo = normalize(tr(si.wo));

    // SurfaceInteraction members
    nsi.uv = si.uv; nsi.shape = si.shape;
    nsi.dpdu = tr(si.dpdu); nsi.dpdv = tr(si.dpdv);
    nsi.dndu = tr(si.dndu); nsi.dndv = tr(si.dndv);
    // SurfaceInteraction::shadingGeometry members
    nsi.shadingGeom.n = normalize(tr(si.shadingGeom.n));
    nsi.shadingGeom.dpdu = tr(si.shadingGeom.dpdu);
    nsi.shadingGeom.dpdv = tr(si.shadingGeom.dpdv);
    nsi.shadingGeom.dndu = tr(si.shadingGeom.dndu);
    nsi.shadingGeom.dndv = tr(si.shadingGeom.dndv);

    nsi.bsdf = si.bsdf; nsi.object = si.object;
    nsi.dudx = si.dudx; nsi.dvdx = si.dvdx;
    nsi.dudy = si.dudy; nsi.dvdy = si.dvdy;
    nsi.dpdx = tr(si.dpdx); nsi.dpdy = tr(si.dpdy);

    // Check if normals should be readjusted
    nsi.shadingGeom.overridesOrientation = si.shadingGeom.overridesOrientation;
    if (nsi.shadingGeom.overridesOrientation)
        nsi.n = faceForward(nsi.n, nsi.shadingGeom.n);
    else
        nsi.shadingGeom.n = faceForward(nsi.shadingGeom.n, nsi.n);

    return nsi;
}